

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O3

void adios2::helper::ParseHostOptionsFile
               (Comm *comm,string *configFileYAML,HostOptions *hosts,string *homePath)

{
  char *pcVar1;
  string nodeName;
  string nodeName_00;
  string nodeName_01;
  string nodeName_02;
  string nodeName_03;
  string nodeName_04;
  string nodeName_05;
  string nodeName_06;
  string nodeName_07;
  string nodeName_08;
  string nodeName_09;
  string nodeName_10;
  string nodeName_11;
  string nodeName_12;
  string nodeName_13;
  string nodeName_14;
  string nodeName_15;
  bool bVar2;
  int iVar3;
  long *plVar4;
  Node *pNVar5;
  undefined8 *puVar6;
  InvalidNode *pIVar7;
  size_type *psVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type sVar11;
  node **ppnVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  value vVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  string authStr;
  iterator itHost;
  const_iterator itDoc;
  string hint;
  HostConfig hc;
  Node hostentry;
  string protocolStr;
  string hostname;
  vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> hostConfigs;
  Node document;
  string configFileContents;
  _Alloc_hider in_stack_fffffffffffff918;
  size_type in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff928;
  undefined7 in_stack_fffffffffffff929;
  undefined8 in_stack_fffffffffffff930;
  _Alloc_hider local_6c8;
  undefined1 auStack_6c0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6a0;
  _Alloc_hider local_698;
  SeqIter SStack_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688;
  element_type *local_678;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_670;
  undefined1 local_660 [32];
  string local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  undefined1 local_5e0 [32];
  HostAccessProtocol local_5c0;
  unsigned_short local_5bc;
  unsigned_short local_5ba;
  _Alloc_hider local_5b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5b0;
  char local_5a8 [8];
  char local_5a0 [8];
  string local_598;
  _Alloc_hider local_578;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_570;
  char local_568 [16];
  HostAuthProtocol local_558;
  undefined4 uStack_554;
  _Alloc_hider local_550;
  undefined1 auStack_548 [8];
  char local_540 [16];
  _Alloc_hider local_530;
  node *local_528;
  undefined1 local_520 [17];
  bool local_50f [3];
  int local_50c;
  undefined1 local_508 [8];
  _Alloc_hider local_500;
  char local_4f8 [8];
  char local_4f0 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4d8;
  node *local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  long *local_4a8;
  long local_4a0;
  long local_498;
  long lStack_490;
  long *local_488;
  long local_480;
  long local_478;
  long lStack_470;
  undefined1 local_468 [24];
  char local_450 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_438;
  Node local_428;
  Node local_3e8;
  undefined1 *local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> local_378;
  Node *local_358;
  string *local_350;
  undefined1 local_348 [16];
  Node *local_338;
  undefined1 local_330 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_318;
  node *local_310;
  undefined1 local_308 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  undefined1 local_2e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined1 local_2c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  undefined1 local_2b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined1 local_288 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined1 local_228 [16];
  Node *local_218;
  undefined1 local_210 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f8;
  node *local_1f0;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148 [48];
  char local_118 [16];
  element_type *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  undefined8 *local_f8;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_148._16_8_ = hosts;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0,
                 "when parsing host config file ",configFileYAML);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_5e0);
  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_600.field_2._M_allocated_capacity = *psVar8;
    local_600.field_2._8_8_ = plVar4[3];
  }
  else {
    local_600.field_2._M_allocated_capacity = *psVar8;
    local_600._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_600._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
    operator_delete((void *)local_5e0._0_8_);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_600._M_dataplus._M_p,
             local_600._M_dataplus._M_p + local_600._M_string_length);
  Comm::BroadcastFile(&local_50,comm,configFileYAML,&local_b0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  YAML::Load((Node *)(local_148 + 0x18),&local_50);
  if ((local_148[0x18] != '\x01') ||
     ((local_f8 != (undefined8 *)0x0 && (**(char **)*local_f8 == '\0')))) {
    local_5e0._0_8_ = local_5e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"Helper","");
    local_468._0_8_ = local_468 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"adiosHostOptions","");
    local_508 = (undefined1  [8])local_4f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"ParseHostOptionsFile","");
    std::operator+(&local_398,"parser error in file ",configFileYAML);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_398);
    psVar8 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar8) {
      auStack_6c0._8_8_ = *psVar8;
      auStack_6c0._16_8_ = plVar4[3];
      local_6c8._M_p = (pointer)((long)auStack_6c0 + 8U);
    }
    else {
      auStack_6c0._8_8_ = *psVar8;
      local_6c8._M_p = (pointer)*plVar4;
    }
    auStack_6c0._0_8_ = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_6c8,(ulong)local_600._M_dataplus._M_p);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 == paVar10) {
      local_688._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_688._8_8_ = plVar4[3];
      local_698._M_p = (pointer)&local_688;
    }
    else {
      local_688._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_698._M_p = (pointer)*plVar4;
    }
    SStack_690._M_current = (node **)plVar4[1];
    *plVar4 = (long)paVar10;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Throw<std::invalid_argument>
              ((string *)local_5e0,(string *)local_468,(string *)local_508,(string *)&local_698,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_p != &local_688) {
      operator_delete(local_698._M_p);
    }
    if (local_6c8._M_p != (pointer)((long)auStack_6c0 + 8U)) {
      operator_delete(local_6c8._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p);
    }
    if (local_508 != (undefined1  [8])local_4f8) {
      operator_delete((void *)local_508);
    }
    if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
      operator_delete((void *)local_468._0_8_);
    }
    if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
      operator_delete((void *)local_5e0._0_8_);
    }
  }
  bVar2 = YAML::Node::IsMap((Node *)(local_148 + 0x18));
  if (!bVar2) {
    local_5e0._0_8_ = local_5e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"Helper","");
    local_468._0_8_ = local_468 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"adiosHostOptions","");
    local_508 = (undefined1  [8])local_4f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"ParseHostOptionsFile","");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_698,
                   "parser error: not a YAML Map of hosts, ",&local_600);
    Throw<std::invalid_argument>
              ((string *)local_5e0,(string *)local_468,(string *)local_508,(string *)&local_698,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_p != &local_688) {
      operator_delete(local_698._M_p);
    }
    if (local_508 != (undefined1  [8])local_4f8) {
      operator_delete((void *)local_508);
    }
    if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
      operator_delete((void *)local_468._0_8_);
    }
    if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
      operator_delete((void *)local_5e0._0_8_);
    }
  }
  if ((local_148[0x18] == '\0') || (local_f8 == (undefined8 *)0x0)) {
    local_698._M_p = local_698._M_p & 0xffffffff00000000;
    SStack_690._M_current = (node **)0x0;
    local_688._M_allocated_capacity = 0;
    local_688._8_8_ = 0;
    local_678 = (element_type *)0x0;
  }
  else {
    YAML::detail::node_data::begin((node_iterator *)local_5e0,*(node_data **)*local_f8);
    local_678 = local_108;
    if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_100->_M_use_count = local_100->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded != '\0') goto LAB_0041fd65;
        LOCK();
        local_100->_M_use_count = local_100->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_100->_M_use_count = local_100->_M_use_count + 1;
LAB_0041fd65:
        local_100->_M_use_count = local_100->_M_use_count + 1;
      }
      local_670._M_pi = local_100;
      local_688._8_8_ = local_5e0._24_8_;
      local_688._M_allocated_capacity = local_5e0._16_8_;
      SStack_690._M_current = (node **)local_5e0._8_8_;
      local_698._M_p = (pointer)local_5e0._0_8_;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
      goto LAB_0041e40a;
    }
    local_698._M_p = (pointer)local_5e0._0_8_;
    SStack_690._M_current = (node **)local_5e0._8_8_;
    local_688._M_allocated_capacity = local_5e0._16_8_;
    local_688._8_8_ = local_5e0._24_8_;
  }
  local_670._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0041e40a:
  local_3a8 = auStack_548;
  local_3a0 = &local_3e8.m_invalidKey.field_2;
LAB_0041e43e:
  if ((local_148[0x18] == '\x01') && (local_f8 != (undefined8 *)0x0)) {
    YAML::detail::node_data::end((node_iterator *)local_5e0,*(node_data **)*local_f8);
    this = local_100;
    sVar11 = local_5e0._16_8_;
    ppnVar12 = (node **)local_5e0._8_8_;
    vVar15 = local_5e0._0_4_;
    if (local_100 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_100->_M_use_count = local_100->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded != '\0') {
          iVar3 = local_100->_M_use_count;
          goto LAB_0041e4f4;
        }
        LOCK();
        local_100->_M_use_count = local_100->_M_use_count + 1;
        UNLOCK();
      }
      else {
        iVar3 = local_100->_M_use_count + 1;
        local_100->_M_use_count = iVar3;
LAB_0041e4f4:
        local_100->_M_use_count = iVar3 + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
    }
  }
  else {
    vVar15 = NoneType;
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sVar11 = 0;
    ppnVar12 = (node **)0x0;
  }
  if ((value)local_698._M_p == vVar15) {
    if (vVar15 == Map) {
      bVar2 = local_688._M_allocated_capacity == sVar11;
    }
    else {
      bVar2 = true;
      if (vVar15 == Sequence) {
        bVar2 = SStack_690._M_current == ppnVar12;
      }
    }
  }
  else {
    bVar2 = false;
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (bVar2) {
    if (local_670._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_670._M_pi);
    }
    if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
    }
    if ((char *)local_148._32_8_ != local_118) {
      operator_delete((void *)local_148._32_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600._M_dataplus._M_p != &local_600.field_2) {
      operator_delete(local_600._M_dataplus._M_p);
    }
    return;
  }
  YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->
            ((proxy *)local_5e0,(iterator_base<const_YAML::detail::iterator_value> *)&local_698);
  if (local_5a0[0] == '\0') {
    pIVar7 = (InvalidNode *)__cxa_allocate_exception(0x40);
    YAML::InvalidNode::InvalidNode(pIVar7,&local_598);
    __cxa_throw(pIVar7,&YAML::InvalidNode::typeinfo,YAML::BadFile::~BadFile);
  }
  local_468._0_8_ = local_5a0;
  YAML::as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::operator()(&local_398,
               (as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                *)local_468);
  if ((node *)local_530._M_p != (node *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_530._M_p);
  }
  if ((undefined1 *)CONCAT44(uStack_554,local_558) != local_3a8) {
    operator_delete((undefined1 *)CONCAT44(uStack_554,local_558));
  }
  if (local_570 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_570);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p);
  }
  if (local_5b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5b0);
  }
  if ((undefined1 *)local_5e0._8_8_ != local_5e0 + 0x18) {
    operator_delete((void *)local_5e0._8_8_);
  }
  YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->
            ((proxy *)local_5e0,(iterator_base<const_YAML::detail::iterator_value> *)&local_698);
  local_508[0] = (string)local_568[8];
  local_500._M_p = local_4f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_500,CONCAT44(uStack_554,local_558),
             local_550._M_p + CONCAT44(uStack_554,local_558));
  local_4e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_540._8_8_;
  local_4d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_530._M_p;
  if ((node *)local_530._M_p == (node *)0x0) {
    local_4d0 = local_528;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_530._M_p + 8))->_M_pi =
           *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_530._M_p + 8))->_M_pi + 1;
      UNLOCK();
      local_4d0 = local_528;
      if ((node *)local_530._M_p == (node *)0x0) goto LAB_0041e6d9;
    }
    else {
      *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_530._M_p + 8))->_M_pi =
           *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_530._M_p + 8))->_M_pi + 1;
    }
    local_4d0 = local_528;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_530._M_p);
  }
LAB_0041e6d9:
  if ((undefined1 *)CONCAT44(uStack_554,local_558) != local_3a8) {
    operator_delete((undefined1 *)CONCAT44(uStack_554,local_558));
  }
  if (local_570 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_570);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p);
  }
  if (local_5b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5b0);
  }
  if ((undefined1 *)local_5e0._8_8_ != local_5e0 + 0x18) {
    operator_delete((void *)local_5e0._8_8_);
  }
  bVar2 = YAML::Node::IsMap((Node *)local_508);
  if (!bVar2) {
    local_5e0._0_8_ = local_5e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"Helper","");
    local_468._0_8_ = local_468 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"adiosHostOptions","");
    local_6c8._M_p = (pointer)((long)auStack_6c0 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"ParseHostOptionsFile","");
    std::operator+(&local_620,"parser error for host ",&local_398);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_620);
    local_660._0_8_ = local_660 + 0x10;
    pNVar5 = (Node *)(plVar4 + 2);
    if ((Node *)*plVar4 == pNVar5) {
      local_660._16_8_ = *(undefined8 *)pNVar5;
      local_660._24_8_ = plVar4[3];
    }
    else {
      local_660._16_8_ = *(undefined8 *)pNVar5;
      local_660._0_8_ = (Node *)*plVar4;
    }
    local_660._8_8_ = plVar4[1];
    *plVar4 = (long)pNVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append(local_660,(ulong)local_600._M_dataplus._M_p);
    pNVar5 = (Node *)(plVar4 + 2);
    if ((Node *)*plVar4 == pNVar5) {
      in_stack_fffffffffffff930 = plVar4[3];
      in_stack_fffffffffffff928 = (undefined1)*(long *)pNVar5;
      in_stack_fffffffffffff929 = (undefined7)((ulong)*(long *)pNVar5 >> 8);
      in_stack_fffffffffffff918._M_p = (pointer)&stack0xfffffffffffff928;
    }
    else {
      in_stack_fffffffffffff928 = (undefined1)*(long *)pNVar5;
      in_stack_fffffffffffff929 = (undefined7)((ulong)*(long *)pNVar5 >> 8);
      in_stack_fffffffffffff918._M_p = (pointer)*plVar4;
    }
    in_stack_fffffffffffff920 = plVar4[1];
    *plVar4 = (long)pNVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Throw<std::invalid_argument>
              ((string *)local_5e0,(string *)local_468,(string *)&local_6c8,
               (string *)&stack0xfffffffffffff918,-1);
    if ((Node *)in_stack_fffffffffffff918._M_p != (Node *)&stack0xfffffffffffff928) {
      operator_delete(in_stack_fffffffffffff918._M_p);
    }
    if ((Node *)local_660._0_8_ != (Node *)(local_660 + 0x10)) {
      operator_delete((void *)local_660._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_620._M_dataplus._M_p != &local_620.field_2) {
      operator_delete(local_620._M_dataplus._M_p);
    }
    if (local_6c8._M_p != (pointer)((long)auStack_6c0 + 8U)) {
      operator_delete(local_6c8._M_p);
    }
    if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
      operator_delete((void *)local_468._0_8_);
    }
    if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
      operator_delete((void *)local_5e0._0_8_);
    }
  }
  local_378.super__Vector_base<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.super__Vector_base<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.super__Vector_base<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((local_508[0] == (string)0x0) || (local_4d0 == (node *)0x0)) {
    local_6c8._M_p = local_6c8._M_p & 0xffffffff00000000;
    auStack_6c0._16_8_ = (element_type *)0x0;
    local_6a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    auStack_6c0._0_8_ = (node **)0x0;
    auStack_6c0._8_8_ = 0;
    local_6a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_0041ea51;
  }
  YAML::detail::node_data::begin
            ((node_iterator *)local_5e0,
             (((local_4d0->m_pRef).
               super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  if ((node *)local_4d8._M_pi == (node *)0x0) {
    auStack_6c0._8_8_ = local_5e0._16_8_;
    auStack_6c0._16_8_ = local_5e0._24_8_;
    local_6c8._M_p = (pointer)local_5e0._0_8_;
    auStack_6c0._0_8_ = local_5e0._8_8_;
    local_6a8._M_pi = local_4e0;
    local_6a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_0041ea51;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_4d8._M_pi)->_M_use_count)->_M_pi
         = *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_4d8._M_pi)->_M_use_count)
                    ->_M_pi + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') goto LAB_0041ea49;
    LOCK();
    *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_4d8._M_pi)->_M_use_count)->_M_pi
         = *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_4d8._M_pi)->_M_use_count)
                    ->_M_pi + 1;
    UNLOCK();
  }
  else {
    *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_4d8._M_pi)->_M_use_count)->_M_pi
         = *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_4d8._M_pi)->_M_use_count)
                    ->_M_pi + 1;
LAB_0041ea49:
    *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_4d8._M_pi)->_M_use_count)->_M_pi
         = *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_4d8._M_pi)->_M_use_count)
                    ->_M_pi + 1;
  }
  local_6a0._M_pi = local_4d8._M_pi;
  local_6a8._M_pi = local_4e0;
  auStack_6c0._16_8_ = local_5e0._24_8_;
  auStack_6c0._8_8_ = local_5e0._16_8_;
  auStack_6c0._0_8_ = local_5e0._8_8_;
  local_6c8._M_p = (pointer)local_5e0._0_8_;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4d8._M_pi);
LAB_0041ea51:
  do {
    if ((local_508[0] == (string)0x1) && (local_4d0 != (node *)0x0)) {
      YAML::detail::node_data::end
                ((node_iterator *)local_5e0,
                 (((local_4d0->m_pRef).
                   super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_pData).super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      this_00._M_pi = local_4d8._M_pi;
      sVar11 = local_5e0._16_8_;
      ppnVar12 = (node **)local_5e0._8_8_;
      vVar15 = local_5e0._0_4_;
      if ((node *)local_4d8._M_pi == (node *)0x0) {
        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_4d8._M_pi)->_M_use_count)
                   ->_M_pi =
               *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                        &(local_4d8._M_pi)->_M_use_count)->_M_pi + 1;
          UNLOCK();
          if (__libc_single_threaded != '\0') {
            iVar3 = *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &(local_4d8._M_pi)->_M_use_count)->_M_pi;
            goto LAB_0041eb07;
          }
          LOCK();
          *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_4d8._M_pi)->_M_use_count)
                   ->_M_pi =
               *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                        &(local_4d8._M_pi)->_M_use_count)->_M_pi + 1;
          UNLOCK();
        }
        else {
          iVar3 = *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &(local_4d8._M_pi)->_M_use_count)->_M_pi + 1;
          *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_4d8._M_pi)->_M_use_count)
                   ->_M_pi = iVar3;
LAB_0041eb07:
          *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_4d8._M_pi)->_M_use_count)
                   ->_M_pi = iVar3 + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4d8._M_pi);
      }
    }
    else {
      vVar15 = NoneType;
      this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      sVar11 = 0;
      ppnVar12 = (node **)0x0;
    }
    if ((value)local_6c8._M_p == vVar15) {
      if (vVar15 == Map) {
        bVar2 = auStack_6c0._8_8_ == sVar11;
      }
      else {
        bVar2 = true;
        if (vVar15 == Sequence) {
          bVar2 = (node **)auStack_6c0._0_8_ == ppnVar12;
        }
      }
    }
    else {
      bVar2 = false;
    }
    if ((node *)this_00._M_pi != (node *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    if (bVar2) break;
    HostConfig::HostConfig((HostConfig *)local_5e0);
    pcVar1 = local_468 + 0x10;
    YAML::detail::iterator_base<YAML::detail::iterator_value>::operator->
              ((proxy *)local_468,(iterator_base<YAML::detail::iterator_value> *)&local_6c8);
    if (local_428.m_isValid == false) {
      pIVar7 = (InvalidNode *)__cxa_allocate_exception(0x40);
      YAML::InvalidNode::InvalidNode(pIVar7,&local_428.m_invalidKey);
      __cxa_throw(pIVar7,&YAML::InvalidNode::typeinfo,YAML::BadFile::~BadFile);
    }
    local_660._0_8_ = &local_428;
    YAML::
    as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    operator()((string *)&stack0xfffffffffffff918,
               (as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                *)local_660);
    std::__cxx11::string::operator=((string *)local_5e0,(string *)&stack0xfffffffffffff918);
    if ((Node *)in_stack_fffffffffffff918._M_p != (Node *)&stack0xfffffffffffff928) {
      operator_delete(in_stack_fffffffffffff918._M_p);
    }
    pNVar5 = (Node *)(local_660 + 0x10);
    if (local_3e8.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3e8.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8.m_invalidKey._M_dataplus._M_p != local_3a0) {
      operator_delete(local_3e8.m_invalidKey._M_dataplus._M_p);
    }
    if (local_428.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_428.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428.m_invalidKey._M_dataplus._M_p != &local_428.m_invalidKey.field_2) {
      operator_delete(local_428.m_invalidKey._M_dataplus._M_p);
    }
    if (local_438._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_438._M_pi);
    }
    if ((char *)local_468._8_8_ != local_450) {
      operator_delete((void *)local_468._8_8_);
    }
    YAML::detail::iterator_base<YAML::detail::iterator_value>::operator->
              ((proxy *)local_468,(iterator_base<YAML::detail::iterator_value> *)&local_6c8);
    if (local_3e8.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_3e8.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8.m_invalidKey._M_dataplus._M_p != local_3a0) {
      operator_delete(local_3e8.m_invalidKey._M_dataplus._M_p);
    }
    if (local_428.m_pMemory.
        super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_428.m_pMemory.
                 super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428.m_invalidKey._M_dataplus._M_p != &local_428.m_invalidKey.field_2) {
      operator_delete(local_428.m_invalidKey._M_dataplus._M_p);
    }
    if (local_438._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_438._M_pi);
    }
    if ((char *)local_468._8_8_ != local_450) {
      operator_delete((void *)local_468._8_8_);
    }
    bVar2 = YAML::Node::IsMap(&local_3e8);
    if (!bVar2) {
      local_468._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Helper","");
      in_stack_fffffffffffff918._M_p = &stack0xfffffffffffff928;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffff918,"adiosHostOptions","");
      local_660._0_8_ = pNVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"ParseHostOptionsFile","")
      ;
      std::operator+(&local_4c8,"parser error for host ",&local_398);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_4c8);
      local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar10) {
        local_640.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_640.field_2._8_8_ = plVar4[3];
      }
      else {
        local_640.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_640._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_640._M_string_length = plVar4[1];
      *plVar4 = (long)paVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_640,(ulong)local_600._M_dataplus._M_p);
      local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_620.field_2._M_allocated_capacity = *psVar8;
        local_620.field_2._8_8_ = plVar4[3];
      }
      else {
        local_620.field_2._M_allocated_capacity = *psVar8;
        local_620._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_620._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      Throw<std::invalid_argument>
                ((string *)local_468,(string *)&stack0xfffffffffffff918,(string *)local_660,
                 &local_620,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_620._M_dataplus._M_p != &local_620.field_2) {
        operator_delete(local_620._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_640._M_dataplus._M_p != &local_640.field_2) {
        operator_delete(local_640._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p);
      }
      if ((Node *)local_660._0_8_ != pNVar5) {
        operator_delete((void *)local_660._0_8_);
      }
      if ((Node *)in_stack_fffffffffffff918._M_p != (Node *)&stack0xfffffffffffff928) {
        operator_delete(in_stack_fffffffffffff918._M_p);
      }
      if ((char *)local_468._0_8_ != pcVar1) {
        operator_delete((void *)local_468._0_8_);
      }
    }
    local_158._M_allocated_capacity = (size_type)local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_168 + 0x10),"verbose","");
    nodeName._M_string_length = in_stack_fffffffffffff920;
    nodeName._M_dataplus._M_p = in_stack_fffffffffffff918._M_p;
    nodeName.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
    nodeName.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
    nodeName.field_2._8_8_ = in_stack_fffffffffffff930;
    anon_unknown_0::SetOption<int>
              (&local_50c,nodeName,(Node *)local_158._M_allocated_capacity,(string *)local_158._8_8_
               ,SUB81(&local_3e8,0));
    if ((Node *)local_158._M_allocated_capacity != (Node *)local_148) {
      operator_delete((void *)local_158._M_allocated_capacity);
    }
    local_468._8_8_ = (char *)0x0;
    local_468[0x10] = '\0';
    local_178._M_allocated_capacity = (size_type)local_168;
    local_468._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_188 + 0x10),"protocol","");
    nodeName_00._M_string_length = in_stack_fffffffffffff920;
    nodeName_00._M_dataplus._M_p = in_stack_fffffffffffff918._M_p;
    nodeName_00.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
    nodeName_00.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
    nodeName_00.field_2._8_8_ = in_stack_fffffffffffff930;
    (anonymous_namespace)::SetOption<std::__cxx11::string>
              ((_anonymous_namespace_ *)local_468,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_178._M_allocated_capacity,nodeName_00,(Node *)local_178._8_8_,
               (string *)&local_3e8,false);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_178._M_allocated_capacity !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168) {
      operator_delete((void *)local_178._M_allocated_capacity);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_468._0_8_,(char *)(local_468._8_8_ + local_468._0_8_));
    local_5c0 = GetHostAccessProtocol(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_5c0 == SSH) {
      _Var14._M_p = &stack0xfffffffffffff928;
      in_stack_fffffffffffff920 = 0;
      in_stack_fffffffffffff928 = '\0';
      local_198._M_allocated_capacity = (size_type)local_188;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_1a8 + 0x10),"authentication","");
      nodeName_10._M_string_length = in_stack_fffffffffffff920;
      nodeName_10._M_dataplus._M_p = _Var14._M_p;
      nodeName_10.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
      nodeName_10.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
      nodeName_10.field_2._8_8_ = in_stack_fffffffffffff930;
      (anonymous_namespace)::SetOption<std::__cxx11::string>
                ((_anonymous_namespace_ *)&stack0xfffffffffffff918,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_198._M_allocated_capacity,nodeName_10,(Node *)local_198._8_8_,
                 (string *)&local_3e8,false);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_198._M_allocated_capacity !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188) {
        operator_delete((void *)local_198._M_allocated_capacity);
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,_Var14._M_p,_Var14._M_p + in_stack_fffffffffffff920);
      local_558 = GetHostAuthProtocol(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      local_1b8._M_allocated_capacity = (size_type)local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_1c8 + 0x10),"host","");
      nodeName_11._M_string_length = in_stack_fffffffffffff920;
      nodeName_11._M_dataplus._M_p = _Var14._M_p;
      nodeName_11.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
      nodeName_11.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
      nodeName_11.field_2._8_8_ = in_stack_fffffffffffff930;
      (anonymous_namespace)::SetOption<std::__cxx11::string>
                ((_anonymous_namespace_ *)&local_5b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1b8._M_allocated_capacity,nodeName_11,(Node *)local_1b8._8_8_,
                 (string *)&local_3e8,false);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1b8._M_allocated_capacity !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8) {
        operator_delete((void *)local_1b8._M_allocated_capacity);
      }
      local_1d8._M_allocated_capacity = (size_type)local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_1e8 + 0x10),"user","");
      nodeName_12._M_string_length = in_stack_fffffffffffff920;
      nodeName_12._M_dataplus._M_p = _Var14._M_p;
      nodeName_12.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
      nodeName_12.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
      nodeName_12.field_2._8_8_ = in_stack_fffffffffffff930;
      (anonymous_namespace)::SetOption<std::__cxx11::string>
                ((_anonymous_namespace_ *)&local_598,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1d8._M_allocated_capacity,nodeName_12,(Node *)local_1d8._8_8_,
                 (string *)&local_3e8,false);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_1d8._M_allocated_capacity !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8) {
        operator_delete((void *)local_1d8._M_allocated_capacity);
      }
      local_1f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"serverpath","");
      nodeName_13._M_string_length = in_stack_fffffffffffff920;
      nodeName_13._M_dataplus._M_p = _Var14._M_p;
      nodeName_13.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
      nodeName_13.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
      nodeName_13.field_2._8_8_ = in_stack_fffffffffffff930;
      (anonymous_namespace)::SetOption<std::__cxx11::string>
                ((_anonymous_namespace_ *)&local_578,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1f8._M_pi,nodeName_13,(Node *)local_1f0,(string *)&local_3e8,false);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8) {
        operator_delete(local_1f8._M_pi);
      }
      local_218 = (Node *)(local_210 + 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"port","");
      nodeName_14._M_string_length = in_stack_fffffffffffff920;
      nodeName_14._M_dataplus._M_p = _Var14._M_p;
      nodeName_14.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
      nodeName_14.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
      nodeName_14.field_2._8_8_ = in_stack_fffffffffffff930;
      anon_unknown_0::SetOption<unsigned_short>
                (&local_5bc,nodeName_14,local_218,(string *)local_210._0_8_,SUB81(&local_3e8,0));
      if (local_218 != (Node *)(local_210 + 8)) {
        operator_delete(local_218);
      }
      local_238._M_allocated_capacity = (size_type)local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_248 + 0x10),"local_port","");
      nodeName_15._M_string_length = in_stack_fffffffffffff920;
      nodeName_15._M_dataplus._M_p = _Var14._M_p;
      nodeName_15.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
      nodeName_15.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
      nodeName_15.field_2._8_8_ = in_stack_fffffffffffff930;
      anon_unknown_0::SetOption<unsigned_short>
                (&local_5ba,nodeName_15,(Node *)local_238._M_allocated_capacity,
                 (string *)local_238._8_8_,SUB81(&local_3e8,0));
      pNVar5 = (Node *)local_228;
      uVar13 = local_238._M_allocated_capacity;
LAB_0041f7df:
      if ((Node *)uVar13 != pNVar5) {
        operator_delete((void *)uVar13);
      }
      pNVar5 = (Node *)&stack0xfffffffffffff928;
      in_stack_fffffffffffff918._M_p = _Var14._M_p;
LAB_0041f7f2:
      if ((Node *)_Var14._M_p != pNVar5) {
LAB_0041f7f7:
        operator_delete(_Var14._M_p);
      }
    }
    else {
      if (local_5c0 == XRootD) {
        _Var14._M_p = &stack0xfffffffffffff928;
        in_stack_fffffffffffff920 = 0;
        in_stack_fffffffffffff928 = '\0';
        local_258._M_allocated_capacity = (size_type)local_248;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_268 + 0x10),"authentication","");
        nodeName_05._M_string_length = in_stack_fffffffffffff920;
        nodeName_05._M_dataplus._M_p = _Var14._M_p;
        nodeName_05.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
        nodeName_05.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
        nodeName_05.field_2._8_8_ = in_stack_fffffffffffff930;
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  ((_anonymous_namespace_ *)&stack0xfffffffffffff918,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_258._M_allocated_capacity,nodeName_05,(Node *)local_258._8_8_,
                   (string *)&local_3e8,false);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_258._M_allocated_capacity !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248) {
          operator_delete((void *)local_258._M_allocated_capacity);
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,_Var14._M_p,_Var14._M_p + in_stack_fffffffffffff920);
        local_558 = GetHostAuthProtocol(&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        local_278._M_allocated_capacity = (size_type)local_268;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_288 + 0x10),"host","");
        nodeName_06._M_string_length = in_stack_fffffffffffff920;
        nodeName_06._M_dataplus._M_p = _Var14._M_p;
        nodeName_06.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
        nodeName_06.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
        nodeName_06.field_2._8_8_ = in_stack_fffffffffffff930;
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  ((_anonymous_namespace_ *)&local_5b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_278._M_allocated_capacity,nodeName_06,(Node *)local_278._8_8_,
                   (string *)&local_3e8,false);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_278._M_allocated_capacity !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268) {
          operator_delete((void *)local_278._M_allocated_capacity);
        }
        local_298._M_allocated_capacity = (size_type)local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"user","");
        nodeName_07._M_string_length = in_stack_fffffffffffff920;
        nodeName_07._M_dataplus._M_p = _Var14._M_p;
        nodeName_07.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
        nodeName_07.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
        nodeName_07.field_2._8_8_ = in_stack_fffffffffffff930;
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  ((_anonymous_namespace_ *)&local_598,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_298._M_allocated_capacity,nodeName_07,(Node *)local_298._8_8_,
                   (string *)&local_3e8,false);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_298._M_allocated_capacity !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288) {
          operator_delete((void *)local_298._M_allocated_capacity);
        }
        local_2b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_2b0 + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"serverpath","");
        nodeName_08._M_string_length = in_stack_fffffffffffff920;
        nodeName_08._M_dataplus._M_p = _Var14._M_p;
        nodeName_08.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
        nodeName_08.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
        nodeName_08.field_2._8_8_ = in_stack_fffffffffffff930;
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  ((_anonymous_namespace_ *)&local_578,local_2b8,nodeName_08,(Node *)local_2b0._0_8_
                   ,(string *)&local_3e8,false);
        if (local_2b8 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2b0 + 8)) {
          operator_delete(local_2b8);
        }
        local_2d8._M_allocated_capacity = (size_type)local_2c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_2e8 + 0x10),"port","");
        nodeName_09._M_string_length = in_stack_fffffffffffff920;
        nodeName_09._M_dataplus._M_p = _Var14._M_p;
        nodeName_09.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
        nodeName_09.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
        nodeName_09.field_2._8_8_ = in_stack_fffffffffffff930;
        anon_unknown_0::SetOption<unsigned_short>
                  (&local_5bc,nodeName_09,(Node *)local_2d8._M_allocated_capacity,
                   (string *)local_2d8._8_8_,SUB81(&local_3e8,0));
        pNVar5 = (Node *)local_2c8;
        uVar13 = local_2d8._M_allocated_capacity;
        goto LAB_0041f7df;
      }
      if (local_5c0 == S3) {
        local_2f8._M_allocated_capacity = (size_type)local_2e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_308 + 0x10),"profile","");
        nodeName_01._M_string_length = in_stack_fffffffffffff920;
        nodeName_01._M_dataplus._M_p = in_stack_fffffffffffff918._M_p;
        nodeName_01.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
        nodeName_01.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
        nodeName_01.field_2._8_8_ = in_stack_fffffffffffff930;
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  ((_anonymous_namespace_ *)&local_530,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_2f8._M_allocated_capacity,nodeName_01,(Node *)local_2f8._8_8_,
                   (string *)&local_3e8,false);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_2f8._M_allocated_capacity !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8) {
          operator_delete((void *)local_2f8._M_allocated_capacity);
        }
        local_318._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"endpoint","");
        nodeName_02._M_string_length = in_stack_fffffffffffff920;
        nodeName_02._M_dataplus._M_p = in_stack_fffffffffffff918._M_p;
        nodeName_02.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
        nodeName_02.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
        nodeName_02.field_2._8_8_ = in_stack_fffffffffffff930;
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  ((_anonymous_namespace_ *)&local_550,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_318._M_pi,nodeName_02,(Node *)local_310,(string *)&local_3e8,false);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._M_pi !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308) {
          operator_delete(local_318._M_pi);
        }
        local_338 = (Node *)(local_330 + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"aws_ec2_metadata","");
        nodeName_03._M_string_length = in_stack_fffffffffffff920;
        nodeName_03._M_dataplus._M_p = in_stack_fffffffffffff918._M_p;
        nodeName_03.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
        nodeName_03.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
        nodeName_03.field_2._8_8_ = in_stack_fffffffffffff930;
        anon_unknown_0::SetOption<bool>
                  ((bool *)(local_520 + 0x10),nodeName_03,local_338,(string *)local_330._0_8_,
                   SUB81(&local_3e8,0));
        if (local_338 != (Node *)(local_330 + 8)) {
          operator_delete(local_338);
        }
        local_358 = (Node *)local_348;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"recheck_metadata","");
        nodeName_04._M_string_length = in_stack_fffffffffffff920;
        nodeName_04._M_dataplus._M_p = in_stack_fffffffffffff918._M_p;
        nodeName_04.field_2._M_local_buf[0] = in_stack_fffffffffffff928;
        nodeName_04.field_2._M_allocated_capacity._1_7_ = in_stack_fffffffffffff929;
        nodeName_04.field_2._8_8_ = in_stack_fffffffffffff930;
        anon_unknown_0::SetOption<bool>
                  (local_50f,nodeName_04,local_358,local_350,SUB81(&local_3e8,0));
        pNVar5 = (Node *)local_348;
        _Var14._M_p = &local_358->m_isValid;
        goto LAB_0041f7f2;
      }
      _Var14._M_p = &stack0xfffffffffffff928;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffff918,"Helper","");
      local_660._0_8_ = pNVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"adiosHostOptions","");
      local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_620,"ParseHostOptionsFile","");
      std::operator+(&local_d0,"parser error: invalid access host protocol \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468)
      ;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_4a8 = &local_498;
      plVar9 = plVar4 + 2;
      if ((long *)*plVar4 == plVar9) {
        local_498 = *plVar9;
        lStack_490 = plVar4[3];
      }
      else {
        local_498 = *plVar9;
        local_4a8 = (long *)*plVar4;
      }
      local_4a0 = plVar4[1];
      *plVar4 = (long)plVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_4a8,local_5e0._0_8_);
      local_488 = &local_478;
      plVar9 = plVar4 + 2;
      if ((long *)*plVar4 == plVar9) {
        local_478 = *plVar9;
        lStack_470 = plVar4[3];
      }
      else {
        local_478 = *plVar9;
        local_488 = (long *)*plVar4;
      }
      local_480 = plVar4[1];
      *plVar4 = (long)plVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_488);
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4c8.field_2._M_allocated_capacity = *psVar8;
        local_4c8.field_2._8_8_ = plVar4[3];
      }
      else {
        local_4c8.field_2._M_allocated_capacity = *psVar8;
        local_4c8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_4c8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_4c8,(ulong)local_600._M_dataplus._M_p)
      ;
      local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_640.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_640.field_2._8_8_ = puVar6[3];
      }
      else {
        local_640.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_640._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_640._M_string_length = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      Throw<std::invalid_argument>
                ((string *)&stack0xfffffffffffff918,(string *)local_660,&local_620,&local_640,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_640._M_dataplus._M_p != &local_640.field_2) {
        operator_delete(local_640._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p);
      }
      if (local_488 != &local_478) {
        operator_delete(local_488);
      }
      if (local_4a8 != &local_498) {
        operator_delete(local_4a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_620._M_dataplus._M_p != &local_620.field_2) {
        operator_delete(local_620._M_dataplus._M_p);
      }
      if ((Node *)local_660._0_8_ != pNVar5) {
        operator_delete((void *)local_660._0_8_);
      }
      in_stack_fffffffffffff918._M_p = _Var14._M_p;
      if ((Node *)_Var14._M_p != (Node *)&stack0xfffffffffffff928) goto LAB_0041f7f7;
    }
    std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>::push_back
              (&local_378,(HostConfig *)local_5e0);
    if ((char *)local_468._0_8_ != pcVar1) {
      operator_delete((void *)local_468._0_8_);
    }
    if ((node *)local_530._M_p != (node *)local_520) {
      operator_delete(local_530._M_p);
    }
    if (local_550._M_p != local_540) {
      operator_delete(local_550._M_p);
    }
    if (local_578._M_p != local_568) {
      operator_delete(local_578._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p);
    }
    if (local_5b8._M_p != local_5a8) {
      operator_delete(local_5b8._M_p);
    }
    if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
      operator_delete((void *)local_5e0._0_8_);
    }
    YAML::detail::node_iterator_base<YAML::detail::node>::operator++
              ((node_iterator_base<YAML::detail::node> *)&local_6c8);
  } while( true );
  if ((node *)local_6a0._M_pi != (node *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6a0._M_pi);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>>
  ::
  _M_emplace_unique<std::__cxx11::string&,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>>
              *)local_148._16_8_,&local_398,&local_378);
  std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>::~vector(&local_378);
  if ((node *)local_4d8._M_pi != (node *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4d8._M_pi);
  }
  if (local_500._M_p != local_4f0) {
    operator_delete(local_500._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  YAML::detail::node_iterator_base<YAML::detail::node>::operator++
            ((node_iterator_base<YAML::detail::node> *)&local_698);
  goto LAB_0041e43e;
}

Assistant:

void ParseHostOptionsFile(Comm &comm, const std::string &configFileYAML, HostOptions &hosts,
                          std::string &homePath)
{
    const std::string hint =
        "when parsing host config file " + configFileYAML + " in call to ADIOS constructor";

    const std::string configFileContents = comm.BroadcastFile(configFileYAML, hint);

    const YAML::Node document = YAML::Load(configFileContents);
    if (!document)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosHostOptions", "ParseHostOptionsFile",
            "parser error in file " + configFileYAML +
                ": invalid format. Check with any YAML editor if format is ill-formed, " + hint);
    }

    if (!document.IsMap())
    {
        helper::Throw<std::invalid_argument>("Helper", "adiosHostOptions", "ParseHostOptionsFile",
                                             "parser error: not a YAML Map of hosts, " + hint);
    }

    /* top level is a dictionary of <hostname, dictionary of options> */
    for (auto itDoc = document.begin(); itDoc != document.end(); ++itDoc)
    {
        std::string hostname = itDoc->first.as<std::string>();

        /* a dictionary of host options, with each entry a dictionary */
        YAML::Node hostentry = itDoc->second;
        if (!hostentry.IsMap())
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "adiosHostOptions", "ParseHostOptionsFile",
                "parser error for host " + hostname +
                    ": each host must have a YAML Map of options, " + hint);
        }

        std::vector<HostConfig> hostConfigs;
        for (auto itHost = hostentry.begin(); itHost != hostentry.end(); ++itHost)
        {
            /* one connection setup as a dictionary */
            HostConfig hc;
            hc.name = itHost->first.as<std::string>();
            const YAML::Node &hostmap = itHost->second;
            if (!hostmap.IsMap())
            {
                helper::Throw<std::invalid_argument>(
                    "Helper", "adiosHostOptions", "ParseHostOptionsFile",
                    "parser error for host " + hostname +
                        ": each entry in the list must be a YAML Map, " + hint);
            }

            SetOption(hc.verbose, "verbose", hostmap, hint);
            std::string protocolStr;
            SetOption(protocolStr, "protocol", hostmap, hint, isMandatory);
            hc.protocol = GetHostAccessProtocol(protocolStr);
            switch (hc.protocol)
            {
            case HostAccessProtocol::SSH: {
                std::string authStr;
                SetOption(authStr, "authentication", hostmap, hint, isMandatory);
                hc.authentication = GetHostAuthProtocol(authStr);
                SetOption(hc.hostname, "host", hostmap, hint, isMandatory);
                SetOption(hc.username, "user", hostmap, hint);
                SetOption(hc.remoteServerPath, "serverpath", hostmap, hint, isMandatory);
                SetOption(hc.port, "port", hostmap, hint);
                SetOption(hc.localPort, "local_port", hostmap, hint);
                break;
            }
            case HostAccessProtocol::XRootD: {
                std::string authStr;
                SetOption(authStr, "authentication", hostmap, hint, isMandatory);
                hc.authentication = GetHostAuthProtocol(authStr);
                SetOption(hc.hostname, "host", hostmap, hint, isMandatory);
                SetOption(hc.username, "user", hostmap, hint);
                SetOption(hc.remoteServerPath, "serverpath", hostmap, hint);
                SetOption(hc.port, "port", hostmap, hint);
                break;
            }
            case HostAccessProtocol::S3: {
                SetOption(hc.awsProfile, "profile", hostmap, hint);
                SetOption(hc.endpoint, "endpoint", hostmap, hint, isMandatory);
                SetOption(hc.isAWS_EC2, "aws_ec2_metadata", hostmap, hint);
                SetOption(hc.recheckMetadata, "recheck_metadata", hostmap, hint);
                break;
            }
            default:
                helper::Throw<std::invalid_argument>(
                    "Helper", "adiosHostOptions", "ParseHostOptionsFile",
                    "parser error: invalid access host protocol '" + protocolStr + " for " +
                        hc.name + "', " + hint);
            }

            hostConfigs.push_back(hc);
        }
        hosts.emplace(hostname, hostConfigs);
    }
}